

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O2

void __thiscall rw::World::enumerateLights(World *this,WorldLights *lightData)

{
  undefined8 uVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  LLLink *pLVar5;
  int iVar6;
  LLLink *pLVar7;
  int iVar8;
  long lVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  iVar3 = lightData->numDirectionals;
  iVar4 = lightData->numLocals;
  lightData->numLocals = 0;
  fVar10 = 0.0;
  fVar11 = 0.0;
  lightData->numAmbients = 0;
  (lightData->ambient).red = 0.0;
  (lightData->ambient).green = 0.0;
  (lightData->ambient).blue = 0.0;
  *(undefined8 *)&(lightData->ambient).alpha = 0x3f800000;
  fVar12 = 0.0;
  iVar6 = 0;
  iVar8 = 0;
  pLVar5 = (this->globalLights).link.next;
  while (pLVar7 = pLVar5, pLVar7 != &(this->globalLights).link) {
    pLVar5 = pLVar7->next;
    cVar2 = *(char *)((long)&pLVar7[-4].next + 1);
    if (cVar2 == '\x01') {
      if (iVar8 < iVar3) {
        lVar9 = (long)iVar8;
        iVar8 = iVar8 + 1;
        lightData->numDirectionals = iVar8;
        lightData->directionals[lVar9] = (Light *)(pLVar7 + -4);
      }
    }
    else if (cVar2 == '\x02') {
      uVar1 = *(undefined8 *)((long)&pLVar7[-2].prev + 4);
      fVar10 = fVar10 + (float)uVar1;
      fVar11 = fVar11 + (float)((ulong)uVar1 >> 0x20);
      (lightData->ambient).red = (float32)fVar10;
      (lightData->ambient).green = (float32)fVar11;
      fVar12 = fVar12 + *(float *)((long)&pLVar7[-1].next + 4);
      (lightData->ambient).blue = (float32)fVar12;
      iVar6 = iVar6 + 1;
      lightData->numAmbients = iVar6;
    }
  }
  pLVar5 = (this->localLights).link.next;
  lVar9 = 0;
  while ((pLVar5 != &(this->localLights).link && ((int)lVar9 < iVar4))) {
    pLVar7 = pLVar5->next;
    lightData->numLocals = (int32)(lVar9 + 1);
    lightData->locals[lVar9] = (Light *)(pLVar5 + -4);
    pLVar5 = pLVar7;
    lVar9 = lVar9 + 1;
  }
  return;
}

Assistant:

void
World::enumerateLights(WorldLights *lightData)
{
	int32 maxDirectionals, maxLocals;

	maxDirectionals = lightData->numDirectionals;
	maxLocals = lightData->numLocals;

	lightData->numDirectionals = 0;
	lightData->numLocals = 0;
	lightData->numAmbients = 0;
	lightData->ambient.red = 0.0f;
	lightData->ambient.green = 0.0f;
	lightData->ambient.blue = 0.0f;
	lightData->ambient.alpha = 1.0f;

	FORLIST(lnk, this->globalLights){
		Light *l = Light::fromWorld(lnk);
		if(l->getType() == Light::AMBIENT){
			lightData->ambient.red   += l->color.red;
			lightData->ambient.green += l->color.green;
			lightData->ambient.blue  += l->color.blue;
			lightData->numAmbients++;
		}else if(l->getType() == Light::DIRECTIONAL){
			if(lightData->numDirectionals < maxDirectionals)
				lightData->directionals[lightData->numDirectionals++] = l;
		}
	}

	FORLIST(lnk, this->localLights){
		if(lightData->numLocals >= maxLocals)
			return;

		Light *l = Light::fromWorld(lnk);
		lightData->locals[lightData->numLocals++] = l;
	}
}